

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDM.h
# Opt level: O2

int ConnectMDM(MDM *pMDM,char *szCfgFilePath)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char line [256];
  
  memset(pMDM->szCfgFilePath,0,0x100);
  sprintf(pMDM->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(line,0,0x100);
    memset(pMDM->szDevPath + 5,0,0xfb);
    builtin_strncpy(pMDM->szDevPath,"COM1",5);
    pMDM->BaudRate = 0x2580;
    pMDM->timeout = 8000;
    pMDM->threadperiod = 100;
    pMDM->bSaveRawData = 1;
    pMDM->MessageLen = 4;
    pMDM->InternalBufferSize = 0x100;
    pMDM->ModemBitRate = 0x28;
    pMDM->DelayReadWriteEchoByte = 0x14;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar2 = "Configuration file not found.";
    }
    else {
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%255s",pMDM->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pMDM->BaudRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pMDM->timeout);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pMDM->threadperiod);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pMDM->bSaveRawData);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pMDM->MessageLen);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pMDM->InternalBufferSize);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pMDM->ModemBitRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      pcVar2 = fgets3((FILE *)__stream,line,0x100);
      if (pcVar2 == (char *)0x0) {
        puts("Invalid configuration file.");
      }
      iVar1 = __isoc99_sscanf(line,"%d",&pMDM->DelayReadWriteEchoByte);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(__stream);
      if (iVar1 == 0) goto LAB_00188c29;
      pcVar2 = "fclose() failed.";
    }
    puts(pcVar2);
  }
LAB_00188c29:
  if (pMDM->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pMDM->threadperiod = 100;
  }
  iVar1 = OpenRS232Port(&pMDM->RS232Port,pMDM->szDevPath);
  if (iVar1 == 0) {
    iVar1 = SetOptionsRS232Port(&pMDM->RS232Port,pMDM->BaudRate,'\0',0,'\b','\0',pMDM->timeout);
    if (iVar1 == 0) {
      puts("MDM connected.");
      return 0;
    }
    puts("Unable to connect to a MDM.");
    CloseRS232Port(&pMDM->RS232Port);
  }
  else {
    puts("Unable to connect to a MDM.");
  }
  return 1;
}

Assistant:

inline int ConnectMDM(MDM* pMDM, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];

	memset(pMDM->szCfgFilePath, 0, sizeof(pMDM->szCfgFilePath));
	sprintf(pMDM->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pMDM->szDevPath, 0, sizeof(pMDM->szDevPath));
		sprintf(pMDM->szDevPath, "COM1");
		pMDM->BaudRate = 9600;
		pMDM->timeout = 8000;
		pMDM->threadperiod = 100;
		pMDM->bSaveRawData = 1;
		pMDM->MessageLen = 4;
		pMDM->InternalBufferSize = 256;
		pMDM->ModemBitRate = 40;
		pMDM->DelayReadWriteEchoByte = 20;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pMDM->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->MessageLen) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->InternalBufferSize) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->ModemBitRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pMDM->DelayReadWriteEchoByte) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pMDM->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pMDM->threadperiod = 100;
	}

	// Used to save raw data, should be handled specifically...
	//pMDM->pfSaveFile = NULL;

	if (OpenRS232Port(&pMDM->RS232Port, pMDM->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a MDM.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pMDM->RS232Port, pMDM->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pMDM->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a MDM.\n");
		CloseRS232Port(&pMDM->RS232Port);
		return EXIT_FAILURE;
	}

	printf("MDM connected.\n");

	return EXIT_SUCCESS;
}